

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

void __thiscall
sqvector<SQObjectPtr>::resize
          (sqvector<SQObjectPtr> *this,SQUnsignedInteger newsize,SQObjectPtr *fill)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectPtr *pSVar3;
  ulong uVar4;
  SQUnsignedInteger SVar5;
  long lVar6;
  
  if (this->_allocated < newsize) {
    pSVar3 = (SQObjectPtr *)sq_vm_realloc(this->_vals,this->_allocated << 4,newsize << 4);
    this->_vals = pSVar3;
    this->_allocated = newsize;
  }
  uVar4 = this->_size;
  if (uVar4 < newsize) {
    do {
      pSVar3 = this->_vals;
      SVar2 = (fill->super_SQObject)._type;
      pSVar3[uVar4].super_SQObject._type = SVar2;
      pSVar3[uVar4].super_SQObject._unVal = (fill->super_SQObject)._unVal;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &((pSVar3[uVar4].super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      uVar4 = this->_size + 1;
      this->_size = uVar4;
    } while (uVar4 < newsize);
  }
  else {
    if (newsize < uVar4) {
      lVar6 = newsize << 4;
      SVar5 = newsize;
      do {
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(this->_vals->super_SQObject)._type + lVar6));
        SVar5 = SVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (SVar5 < this->_size);
    }
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }